

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O0

SQInteger math_exp(HSQUIRRELVM v)

{
  SQFloat *in_RDI;
  SQInteger unaff_retaddr;
  HSQUIRRELVM in_stack_00000008;
  SQFloat f;
  SQFloat in_stack_0000001c;
  HSQUIRRELVM in_stack_00000020;
  undefined4 local_c;
  
  sq_getfloat(in_stack_00000008,unaff_retaddr,in_RDI);
  std::exp((double)(ulong)local_c);
  sq_pushfloat(in_stack_00000020,in_stack_0000001c);
  return 1;
}

Assistant:

static SQInteger math_min_max(HSQUIRRELVM v)
{
  SQInteger nArgs = sq_gettop(v);
  SQObject objRes;
  sq_getstackobj(v, 2, &objRes);

  for (SQInteger i = 3; i <= nArgs; ++i) {
    SQObject cur;
    sq_getstackobj(v, i, &cur);
    if (!(sq_type(cur) & SQOBJECT_NUMERIC)) {
      sq_throwparamtypeerror(v, i, _RT_FLOAT | _RT_INTEGER, sq_type(cur));
      return SQ_ERROR;
    }

    SQInteger cres = 0;
    if (!sq_cmpraw(v, cur, objRes, cres))
      return sq_throwerror(v, _SC("Internal error, comparison failed"));

    if (cres == CmpRes)
      objRes = cur;
  }

  sq_pushobject(v, objRes);
  return 1;
}